

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Point2i resolution;
  int iVar7;
  int iVar8;
  uint uVar9;
  Point2i p;
  ulong uVar10;
  Bounds2i *__range1;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Tuple2<pbrt::Point2,_int> local_68;
  int vb;
  int va;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar9 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar9;
  va = ((bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar1) *
       resolution.super_Tuple2<pbrt::Point2,_int>.x;
  vb = 0;
  if (va < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x511,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x2cbcd0a,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x2cbcd0a,
               &vb);
  }
  if ((int)(uVar9 | uVar1) < 0) {
    LogFatal<char_const(&)[41]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x512,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
  }
  local_38.bits =
       (this->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar1;
  channels.n = (this->channelNames).nStored;
  channels.ptr = (this->channelNames).ptr;
  Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
        alloc);
  local_68 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>;
  iVar6 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y;
  iVar8 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  bVar4 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x <= iVar8;
  bVar5 = iVar6 <= (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  uVar10 = (ulong)local_68 >> 0x20;
  iVar7 = local_68.y;
  if (bVar4 || bVar5) {
    iVar6 = iVar7;
  }
  if (bVar4 || bVar5) {
    iVar8 = local_68.x;
  }
  if (iVar8 != local_68.x) goto LAB_00245673;
  while (iVar6 != iVar7) {
LAB_00245673:
    do {
      if (0 < (int)(this->channelNames).nStored) {
        iVar7 = 0;
        do {
          iVar2 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
          iVar3 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
          value = GetChannel(this,(Point2i)local_68,iVar7,(WrapMode2D)0x200000002);
          p.super_Tuple2<pbrt::Point2,_int>.x = local_68.x - iVar2;
          p.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar10 - iVar3;
          SetChannel(__return_storage_ptr__,p,iVar7,value);
          iVar7 = iVar7 + 1;
        } while (iVar7 < (int)(this->channelNames).nStored);
      }
      uVar9 = local_68.x + 1;
      uVar10 = (ulong)local_68 & 0xffffffff00000000;
      local_68 = (Tuple2<pbrt::Point2,_int>)
                 (uVar10 + 0x100000000 +
                 (ulong)(uint)(bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x);
      if (uVar9 != (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x) {
        local_68 = (Tuple2<pbrt::Point2,_int>)(uVar10 | uVar9);
      }
      uVar10 = (ulong)local_68 >> 0x20;
    } while (iVar8 != local_68.x);
    iVar7 = local_68.y;
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}